

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_NewClassProto(Var protoParent,ScriptContext *scriptContext)

{
  ThreadContext *threadContext;
  JavascriptLibrary *this;
  RecyclableObject *protoParent_00;
  DynamicObject *pDVar1;
  undefined1 local_38 [8];
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var protoParent_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_38,threadContext);
  this = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
  protoParent_00 = VarTo<Js::RecyclableObject>(protoParent);
  pDVar1 = JavascriptLibrary::CreateClassPrototypeObject(this,protoParent_00);
  JsReentLock::~JsReentLock((JsReentLock *)local_38);
  return pDVar1;
}

Assistant:

Var JavascriptOperators::OP_NewClassProto(Var protoParent, ScriptContext * scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_NewClassProto, reentrancylock, scriptContext->GetThreadContext());
        return scriptContext->GetLibrary()->CreateClassPrototypeObject(VarTo<RecyclableObject>(protoParent));
        JIT_HELPER_END(Op_NewClassProto);
    }